

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_method_process.cpp
# Opt level: O2

bool __thiscall sc_core::sc_method_process::trigger_dynamic(sc_method_process *this,sc_event *e)

{
  int *piVar1;
  uint uVar2;
  sc_event *psVar3;
  sc_runnable *psVar4;
  sc_method_process *psVar5;
  sc_event **ppsVar6;
  
  (this->super_sc_process_b).m_timed_out = false;
  psVar5 = (sc_method_process *)sc_get_current_process_b();
  if (psVar5 == this) {
    sc_process_b::report_immediate_self_notification(&this->super_sc_process_b);
    return false;
  }
  if ((this->super_sc_process_b).m_runnable_p != (sc_process_b *)0x0) {
    return true;
  }
  if (((this->super_sc_process_b).m_state & 1) != 0) {
    if ((this->super_sc_process_b).m_timeout_event_p != e) {
      return false;
    }
    sc_process_b::remove_dynamic_events(&this->super_sc_process_b,true);
    return true;
  }
  switch((this->super_sc_process_b).m_trigger_type) {
  case STATIC:
    sc_report_handler::report
              (SC_WARNING,"dynamic event notification encountered when sensitivity is static",
               (this->super_sc_process_b).super_sc_object.m_name._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_method_process.cpp"
               ,0x31a);
    return true;
  case EVENT:
switchD_001e9990_caseD_1:
    ppsVar6 = &(this->super_sc_process_b).m_event_p;
    goto LAB_001e9a82;
  case OR_LIST:
    goto switchD_001e9990_caseD_2;
  case AND_LIST:
    piVar1 = &(this->super_sc_process_b).m_event_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return true;
    }
    break;
  case TIMEOUT:
    goto switchD_001e9990_caseD_4;
  case EVENT_TIMEOUT:
    psVar3 = (this->super_sc_process_b).m_timeout_event_p;
    if (psVar3 != e) {
      sc_event::cancel(psVar3);
      sc_event::reset((this->super_sc_process_b).m_timeout_event_p);
      goto switchD_001e9990_caseD_1;
    }
    (this->super_sc_process_b).m_timed_out = true;
    ppsVar6 = &(this->super_sc_process_b).m_event_p;
    sc_event::remove_dynamic((this->super_sc_process_b).m_event_p,this);
    goto LAB_001e9a82;
  case OR_LIST_TIMEOUT:
    psVar3 = (this->super_sc_process_b).m_timeout_event_p;
    if (psVar3 == e) {
LAB_001e9a55:
      (this->super_sc_process_b).m_timed_out = true;
    }
    else {
      sc_event::cancel(psVar3);
      sc_event::reset((this->super_sc_process_b).m_timeout_event_p);
    }
    goto switchD_001e9990_caseD_2;
  case AND_LIST_TIMEOUT:
    psVar3 = (this->super_sc_process_b).m_timeout_event_p;
    if (psVar3 == e) goto LAB_001e9a55;
    piVar1 = &(this->super_sc_process_b).m_event_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return true;
    }
    sc_event::cancel(psVar3);
    sc_event::reset((this->super_sc_process_b).m_timeout_event_p);
    break;
  default:
    goto switchD_001e9990_default;
  }
LAB_001e9a76:
  ppsVar6 = (sc_event **)&(this->super_sc_process_b).m_event_list_p;
  sc_event_list::auto_delete((sc_event_list *)*ppsVar6);
LAB_001e9a82:
  *ppsVar6 = (sc_event *)0x0;
switchD_001e9990_caseD_4:
  (this->super_sc_process_b).m_trigger_type = STATIC;
switchD_001e9990_default:
  uVar2 = (this->super_sc_process_b).m_state;
  if ((uVar2 & 4) == 0) {
    psVar4 = ((this->super_sc_process_b).super_sc_object.m_simc)->m_runnable;
    (this->super_sc_process_b).m_runnable_p = (sc_process_b *)0xdb;
    (psVar4->m_methods_push_tail->super_sc_process_b).m_runnable_p = &this->super_sc_process_b;
    psVar4->m_methods_push_tail = this;
  }
  else {
    (this->super_sc_process_b).m_state = uVar2 | 2;
  }
  return true;
switchD_001e9990_caseD_2:
  sc_event_list::remove_dynamic((this->super_sc_process_b).m_event_list_p,this,e);
  goto LAB_001e9a76;
}

Assistant:

bool sc_method_process::trigger_dynamic( sc_event* e )
{
    // No time outs yet, and keep gcc happy.

    m_timed_out = false;

    // Escape cases:
    //   (a) If this method issued the notify() don't schedule it for
    //       execution, but leave the sensitivity in place.
    //   (b) If this method is already runnable can't trigger an event.

#if ! defined( SC_ENABLE_IMMEDIATE_SELF_NOTIFICATIONS )
    if( SC_UNLIKELY_( sc_get_current_process_b() == this ) )
    {
        report_immediate_self_notification();
        return false;
    }
#endif // SC_ENABLE_IMMEDIATE_SELF_NOTIFICATIONS

    if( is_runnable() )
        return true;

    // If a process is disabled then we ignore any events, leaving them enabled:
    //
    // But if this is a time out event we need to remove both it and the
    // event that was being waited for.

    if ( m_state & ps_bit_disabled )
    {
        if ( e == m_timeout_event_p )
	{
	    remove_dynamic_events( true );
	    return true;
	}
	else
	{
	    return false;
	}
    }


    // Process based on the event type and current process state:
    //
    // Every case needs to set 'rc' and continue on to the end of
    // this method to allow suspend processing to work correctly.

    switch( m_trigger_type )
    {
      case EVENT:
	m_event_p = 0;
	m_trigger_type = STATIC;
	break;

      case AND_LIST:
        -- m_event_count;
	if ( m_event_count == 0 )
	{
	    m_event_list_p->auto_delete();
	    m_event_list_p = 0;
	    m_trigger_type = STATIC;
	}
	else
	{
	    return true;
	}
	break;

      case OR_LIST:
	m_event_list_p->remove_dynamic( this, e );
	m_event_list_p->auto_delete();
	m_event_list_p = 0;
	m_trigger_type = STATIC;
	break;

      case TIMEOUT:
	m_trigger_type = STATIC;
	break;

      case EVENT_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
	    m_timed_out = true;
	    m_event_p->remove_dynamic( this );
	    m_event_p = 0;
	    m_trigger_type = STATIC;
	}
	else
	{
	    m_timeout_event_p->cancel();
	    m_timeout_event_p->reset();
	    m_event_p = 0;
	    m_trigger_type = STATIC;
	}
	break;

      case OR_LIST_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
            m_timed_out = true;
            m_event_list_p->remove_dynamic( this, e );
            m_event_list_p->auto_delete();
            m_event_list_p = 0;
            m_trigger_type = STATIC;
	}

	else
	{
            m_timeout_event_p->cancel();
            m_timeout_event_p->reset();
	    m_event_list_p->remove_dynamic( this, e );
	    m_event_list_p->auto_delete();
	    m_event_list_p = 0;
	    m_trigger_type = STATIC;
	}
	break;

      case AND_LIST_TIMEOUT:
        if ( e == m_timeout_event_p )
	{
            m_timed_out = true;
            m_event_list_p->remove_dynamic( this, e );
            m_event_list_p->auto_delete();
            m_event_list_p = 0;
            m_trigger_type = STATIC;
	}

	else
	{
	    -- m_event_count;
	    if ( m_event_count == 0 )
	    {
		m_timeout_event_p->cancel();
		m_timeout_event_p->reset();
		// no need to remove_dynamic
		m_event_list_p->auto_delete();
		m_event_list_p = 0;
		m_trigger_type = STATIC;
	    }
	    else
	    {
	        return true;
	    }
	}
	break;

      case STATIC: {
        // we should never get here, but throw_it() can make it happen.
	SC_REPORT_WARNING(SC_ID_NOT_EXPECTING_DYNAMIC_EVENT_NOTIFY_, name());
        return true;
      }
    }

    // If we get here then the method has satisfied its next_trigger, if its
    // suspended mark its state as ready to run. If its not suspended then push
    // it onto the runnable queue.

    if ( (m_state & ps_bit_suspended) )
    {
	m_state = m_state | ps_bit_ready_to_run;
    }
    else
    {
        simcontext()->push_runnable_method(this);
    }

    return true;
}